

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU
          (Minefield_Response_NACK_PDU *this)

{
  Minefield_Response_NACK_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Response_NACK_PDU_003396b8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  this->m_ui8ReqID = '\0';
  this->m_ui8NumMisPdus = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vSeqNums);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '(';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x1a;
  return;
}

Assistant:

Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU() :
    m_ui8ReqID( 0 ),
    m_ui8NumMisPdus( 0 )
{
    m_ui8PDUType = MinefieldResponseNAK_PDU_Type;
    m_ui16PDULength = MINEFIELD_RESPONSE_NACK_SIZE;
}